

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* units::find_unit_pair_abi_cxx11_(unit un)

{
  iterator iVar1;
  const_iterator cVar2;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  long lVar4;
  long lVar5;
  undefined8 *in_RDI;
  allocator local_11;
  key_type local_10;
  
  if ((((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) == 0) ||
      (user_defined_unit_names_abi_cxx11_._24_8_ == 0)) ||
     (iVar1 = std::
              _Hashtable<units::unit,_std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<units::unit,_std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)user_defined_unit_names_abi_cxx11_,&local_10),
     iVar1.
     super__Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
     ._M_cur == (__node_type *)0x0)) {
    cVar2 = std::
            _Hashtable<units::unit,_std::pair<const_units::unit,_const_char_*>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<units::unit,_std::pair<const_units::unit,_const_char_*>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<units::unit>,_std::hash<units::unit>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)base_unit_names,&local_10);
    if (cVar2.super__Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>._M_cur !=
        (__node_type *)0x0) {
      *in_RDI = *(undefined8 *)
                 ((long)cVar2.
                        super__Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>.
                        _M_cur + 8);
      ppVar3 = (pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::__cxx11::string::string
                            ((string *)(in_RDI + 1),
                             *(char **)((long)cVar2.
                                              super__Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>
                                              ._M_cur + 0x10),&local_11);
      return ppVar3;
    }
    *in_RDI = nullret_abi_cxx11_;
    in_RDI[1] = in_RDI + 3;
    lVar4 = DAT_001e1ac0;
    lVar5 = DAT_001e1ab8;
  }
  else {
    *in_RDI = *(undefined8 *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 8);
    in_RDI[1] = in_RDI + 3;
    lVar4 = *(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x18);
    lVar5 = *(long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x10);
  }
  std::__cxx11::string::_M_construct<char*>((string *)(in_RDI + 1),lVar5,lVar4 + lVar5);
  return extraout_RAX;
}

Assistant:

static std::pair<unit, std::string> find_unit_pair(unit un)
{  // cppcheck suppression active
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_unit_names.empty()) {
            auto fndud = user_defined_unit_names.find(un);
            if (fndud != user_defined_unit_names.end()) {
                return {fndud->first, fndud->second};
            }
        }
    }
    auto fnd = base_unit_names.find(un);
    if (fnd != base_unit_names.end()) {
        return {fnd->first, fnd->second};
    }
    return nullret;
}